

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::PoolAllocator::clear(PoolAllocator *this)

{
  PoolAllocatorPrivate *pPVar1;
  _List_node_base *p_Var2;
  
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  pPVar1 = this->d;
  p_Var2 = (_List_node_base *)&pPVar1->budgets;
  while( true ) {
    p_Var2 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&pPVar1->budgets) break;
    free(p_Var2[1]._M_prev);
    pPVar1 = this->d;
  }
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::clear
            (&pPVar1->budgets);
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  return;
}

Assistant:

void PoolAllocator::clear()
{
    d->budgets_lock.lock();

    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        void* ptr = it->second;
        ncnn::fastFree(ptr);
    }
    d->budgets.clear();

    d->budgets_lock.unlock();
}